

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::sync_log_to_new_srv(raft_server *this,ulong start_idx)

{
  uint uVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  peer *this_00;
  long lVar5;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  element_type *peVar7;
  int iVar8;
  undefined8 uVar9;
  ulong uVar10;
  size_t sVar11;
  snapshot_io_mgr *this_01;
  list<std::shared_ptr<nuraft::srv_config>,std::allocator<std::shared_ptr<nuraft::srv_config>>>
  *__position;
  ulong uVar12;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 uVar13;
  ptr<buffer> new_conf_buf;
  ptr<cluster_config> new_conf;
  ptr<req_msg> req;
  undefined1 local_78 [8];
  ptr<log_entry> entry;
  __atomic_base<unsigned_long> local_60;
  ptr<raft_params> params;
  unsigned_long local_48;
  undefined8 local_40;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  uVar13 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    iVar8 = (**(code **)(*(long *)peVar2 + 0x38))();
    if (4 < iVar8) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar1 = ((((this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->id_;
      uVar9 = (**(code **)(*(long *)(this->log_store_).
                                    super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + 0x18))();
      msg_if_given_abi_cxx11_
                ((string *)&new_conf_buf,"[SYNC LOG] peer %d start idx %lu, my log start idx %lu",
                 (ulong)uVar1,start_idx,uVar9);
      (**(code **)(*(long *)peVar2 + 0x40))
                (peVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                 ,"sync_log_to_new_srv",0xd8,(string *)&new_conf_buf);
      std::__cxx11::string::~string((string *)&new_conf_buf);
    }
  }
  if (start_idx < (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i) {
    uVar12 = (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i - start_idx;
  }
  else {
    uVar12 = 0;
  }
  nuraft::context::get_params((context *)&params);
  iVar8 = *(int *)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  + 0x14);
  if ((long)iVar8 < 1) {
    if (iVar8 != 0) goto LAB_001b7c2c;
LAB_001b79d0:
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 != (element_type *)0x0) {
      iVar8 = (**(code **)(*(long *)peVar2 + 0x38))();
      if (3 < iVar8) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&new_conf_buf,
                   "[SYNC LOG] LogSync is done for server %d with log gap %lu (%lu - %lu, limit %d), now put the server into cluster"
                   ,(ulong)(uint)((((this->srv_to_join_).
                                    super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->config_).
                                  super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->id_,uVar12,
                   (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i,start_idx,
                   CONCAT44(uVar13,*(undefined4 *)
                                    (params.
                                     super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + 0x14)));
        (**(code **)(*(long *)peVar2 + 0x40))
                  (peVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"sync_log_to_new_srv",0xe6,&new_conf_buf);
        std::__cxx11::string::~string((string *)&new_conf_buf);
      }
    }
    get_config((raft_server *)&req);
    if ((this->uncommitted_config_).
        super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar8 = (**(code **)(*(long *)peVar2 + 0x38))();
        if (3 < iVar8) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          peVar3 = (this->uncommitted_config_).
                   super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&new_conf_buf,"uncommitted config exists at log %lu, prev log %lu",
                     peVar3->log_idx_,peVar3->prev_log_idx_);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                     ,"sync_log_to_new_srv",0xf0,&new_conf_buf);
          std::__cxx11::string::~string((string *)&new_conf_buf);
        }
      }
      std::__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2> *)&req,
                 &(this->uncommitted_config_).
                  super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>);
    }
    new_conf_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (**(code **)(*(long *)(this->log_store_).
                               super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr + 0x10))();
    entry.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         ((req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super_msg_base)._vptr_msg_base;
    std::make_shared<nuraft::cluster_config,unsigned_long,unsigned_long>
              ((unsigned_long *)&new_conf,(unsigned_long *)&new_conf_buf);
    __position = (list<std::shared_ptr<nuraft::srv_config>,std::allocator<std::shared_ptr<nuraft::srv_config>>>
                  *)(CONCAT71(new_conf.
                              super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._1_7_,
                              (char)new_conf.
                                    super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr) + 0x38);
    std::__cxx11::
    list<std::shared_ptr<nuraft::srv_config>,std::allocator<std::shared_ptr<nuraft::srv_config>>>::
    insert<std::_List_iterator<std::shared_ptr<nuraft::srv_config>>,void>
              (__position,(const_iterator)__position,
               (_List_node_base *)
               ((req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               log_entries_).
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (_List_iterator<std::shared_ptr<nuraft::srv_config>_>)
               &(req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                log_entries_);
    std::__cxx11::
    list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
    ::push_back((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                 *)(CONCAT71(new_conf.
                             super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr._1_7_,
                             (char)new_conf.
                                   super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr) + 0x38),&this->conf_to_add_);
    lVar5 = CONCAT71(new_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr._1_7_,
                     (char)new_conf.
                           super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
    std::__cxx11::string::string
              ((string *)&new_conf_buf,
               (string *)
               &((req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_msg_base).dst_);
    std::__cxx11::string::_M_assign((string *)(lVar5 + 0x18));
    std::__cxx11::string::~string((string *)&new_conf_buf);
    *(char *)(CONCAT71(new_conf.
                       super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       ._1_7_,(char)new_conf.
                                    super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr) + 0x10) =
         (char)((req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_msg_base).type_;
    cluster_config::serialize((cluster_config *)&new_conf_buf);
    local_78 = (undefined1  [8])
               (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
    local_60._M_i._0_1_ = 2;
    local_48 = timer_helper::get_timeofday_us();
    std::
    make_shared<nuraft::log_entry,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type,unsigned_long>
              ((unsigned_long *)&entry,(shared_ptr<nuraft::buffer> *)local_78,
               (log_val_type *)&new_conf_buf,&local_60._M_i);
    store_log_entry(this,&entry,0);
    this->config_changing_ = true;
    std::__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->uncommitted_config_).
                super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>,
               &new_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>);
    request_append_entries(this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&entry.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&new_conf_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    p_Var6 = (__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)
             &new_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>;
  }
  else {
    if (uVar12 < (ulong)(long)iVar8) goto LAB_001b79d0;
LAB_001b7c2c:
    req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
    ;
    req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    uVar10 = (**(code **)(*(long *)(this->log_store_).
                                   super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + 0x18))();
    if (start_idx < uVar10) {
      LOCK();
      (this->srv_to_join_snp_retry_required_)._M_base._M_i = false;
      UNLOCK();
      new_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ =
           '\0';
      create_sync_snapshot_req
                ((raft_server *)&new_conf_buf,(ptr<peer> *)this,(ulong)&this->srv_to_join_,start_idx
                 ,(((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->term_).super___atomic_base<unsigned_long>._M_i,
                 (bool *)(this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i);
      std::__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2> *)&new_conf_buf);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&new_conf_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if ((char)new_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr == '\0') {
        LOCK();
        (this->srv_to_join_snp_retry_required_)._M_base._M_i = true;
        UNLOCK();
        enable_hb_for_peer(this,(this->srv_to_join_).
                                super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ;
        goto LAB_001b7e9d;
      }
    }
    else {
      uVar10 = (long)*(int *)(params.
                              super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 0x10);
      if (uVar12 < (ulong)(long)*(int *)(params.
                                         super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + 0x10)) {
        uVar10 = uVar12;
      }
      peVar4 = (this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (**(code **)(*(long *)peVar4 + 0x60))(&new_conf,peVar4,start_idx,uVar10 & 0xffffffff);
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar8 = (**(code **)(*(long *)peVar2 + 0x38))();
        if (4 < iVar8) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          sVar11 = buffer::size((buffer *)
                                CONCAT71(new_conf.
                                         super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr._1_7_,
                                         (char)new_conf.
                                               super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr));
          msg_if_given_abi_cxx11_
                    ((string *)&new_conf_buf,"size to sync: %d, log_pack size %zu\n",
                     uVar10 & 0xffffffff,sVar11);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                     ,"sync_log_to_new_srv",0x123,&new_conf_buf);
          std::__cxx11::string::~string((string *)&new_conf_buf);
        }
      }
      entry.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->term_).super___atomic_base<unsigned_long>._M_i;
      local_40._4_4_ = 10;
      local_40._0_4_ =
           ((((this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->id_;
      local_78 = (undefined1  [8])0x0;
      local_48 = start_idx - 1;
      local_60._M_i = (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i;
      std::
      make_shared<nuraft::req_msg,unsigned_long,nuraft::msg_type,int&,int,long,unsigned_long,unsigned_long>
                ((unsigned_long *)&new_conf_buf,(msg_type *)&entry,(int *)((long)&local_40 + 4),
                 &this->id_,&local_40,(unsigned_long *)local_78,&local_48);
      std::__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2> *)&new_conf_buf);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&new_conf_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      peVar7 = req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      entry.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->term_).super___atomic_base<unsigned_long>._M_i;
      local_78[0] = 4;
      std::
      make_shared<nuraft::log_entry,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type>
                ((unsigned_long *)&new_conf_buf,(shared_ptr<nuraft::buffer> *)&entry,
                 (log_val_type *)&new_conf);
      std::
      vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
      ::emplace_back<std::shared_ptr<nuraft::log_entry>>
                ((vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
                  *)&peVar7->log_entries_,(shared_ptr<nuraft::log_entry> *)&new_conf_buf);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&new_conf_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&new_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    if (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr[100] !=
        (element_type)0x0) {
      this_01 = snapshot_io_mgr::instance();
      snapshot_io_mgr::invoke(this_01);
      goto LAB_001b7e9d;
    }
    this_00 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,
               &(this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
    peer::send_req(this_00,(ptr<peer> *)&local_38,&req,&this->ex_resp_handler_);
    p_Var6 = &local_38;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var6->_M_refcount);
LAB_001b7e9d:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void raft_server::sync_log_to_new_srv(ulong start_idx) {
    p_db("[SYNC LOG] peer %d start idx %" PRIu64 ", my log start idx %" PRIu64,
         srv_to_join_->get_id(), start_idx, log_store_->start_index());
    // only sync committed logs
    ulong gap = ( quick_commit_index_ > start_idx )
                ? ( quick_commit_index_ - start_idx )
                : 0;
    ptr<raft_params> params = ctx_->get_params();
    if ( ( params->log_sync_stop_gap_ > 0 &&
           gap < (ulong)params->log_sync_stop_gap_ ) ||
         params->log_sync_stop_gap_ == 0 ) {
        p_in( "[SYNC LOG] LogSync is done for server %d "
              "with log gap %" PRIu64 " (%" PRIu64 " - %" PRIu64 ", limit %d), "
              "now put the server into cluster",
              srv_to_join_->get_id(),
              gap, quick_commit_index_.load(), start_idx,
              params->log_sync_stop_gap_ );

        ptr<cluster_config> cur_conf = get_config();

        // WARNING:
        //   If there is any uncommitted changed config,
        //   new config should be generated on top of it.
        if (uncommitted_config_) {
            p_in("uncommitted config exists at log %" PRIu64 ", prev log %" PRIu64,
                 uncommitted_config_->get_log_idx(),
                 uncommitted_config_->get_prev_log_idx());
            cur_conf = uncommitted_config_;
        }

        ptr<cluster_config> new_conf = cs_new<cluster_config>
                                       ( log_store_->next_slot(),
                                         cur_conf->get_log_idx() );
        new_conf->get_servers().insert( new_conf->get_servers().end(),
                                        cur_conf->get_servers().begin(),
                                        cur_conf->get_servers().end() );
        new_conf->get_servers().push_back(conf_to_add_);
        new_conf->set_user_ctx( cur_conf->get_user_ctx() );
        new_conf->set_async_replication
                  ( cur_conf->is_async_replication() );

        ptr<buffer> new_conf_buf(new_conf->serialize());
        ptr<log_entry> entry( cs_new<log_entry>( state_->get_term(),
                                                 new_conf_buf,
                                                 log_val_type::conf,
                                                 timer_helper::get_timeofday_us() ) );
        store_log_entry(entry);
        config_changing_ = true;
        uncommitted_config_ = new_conf;
        request_append_entries();
        return;
    }

    ptr<req_msg> req;

    // Modified by Jung-Sang Ahn, 12/22, 2017.
    // When snapshot transmission is still in progress, start_idx can be 0.
    // We should tolerate this.
    if (/* start_idx > 0 && */ start_idx < log_store_->start_index()) {
        srv_to_join_snp_retry_required_ = false;
        bool succeeded_out = false;
        req = create_sync_snapshot_req( srv_to_join_,
                                        start_idx,
                                        state_->get_term(),
                                        quick_commit_index_,
                                        succeeded_out );
        if (!succeeded_out) {
            // If reading snapshot fails, enable HB temporarily to retry it.
            srv_to_join_snp_retry_required_ = true;
            enable_hb_for_peer(*srv_to_join_);
            return;
        }

    } else {
        int32 size_to_sync = std::min(gap, (ulong)params->log_sync_batch_size_);
        ptr<buffer> log_pack = log_store_->pack(start_idx, size_to_sync);
        p_db( "size to sync: %d, log_pack size %zu\n",
              size_to_sync, log_pack->size() );
        req = cs_new<req_msg>( state_->get_term(),
                               msg_type::sync_log_request,
                               id_,
                               srv_to_join_->get_id(),
                               0L,
                               start_idx - 1,
                               quick_commit_index_.load() );
        req->log_entries().push_back
            ( cs_new<log_entry>
              ( state_->get_term(), log_pack, log_val_type::log_pack) );
    }

    if (!params->use_bg_thread_for_snapshot_io_) {
        // Synchronous IO: directly send here.
        srv_to_join_->send_req(srv_to_join_, req, ex_resp_handler_);
    } else {
        // Asynchronous IO: invoke the thread.
        snapshot_io_mgr::instance().invoke();
    }
}